

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O0

void __thiscall MxxColl_ScatterGeneral_Test::TestBody(MxxColl_ScatterGeneral_Test *this)

{
  allocator<int> *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  reference out;
  char *message;
  AssertHelper local_b8;
  Message local_b0;
  int local_a4;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  int j_1;
  vector<int,_std::allocator<int>_> result;
  size_t j;
  int i;
  size_t msgsize;
  vector<int,_std::allocator<int>_> vec;
  undefined1 local_30 [8];
  comm c;
  MxxColl_ScatterGeneral_Test *this_local;
  
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&ompi_mpi_comm_world;
  c._24_8_ = this;
  mxx::comm::comm((comm *)local_30,
                  (MPI_Comm *)
                  &vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&msgsize);
  iVar2 = mxx::comm::rank((comm *)local_30);
  if (iVar2 == 0) {
    iVar2 = mxx::comm::size((comm *)local_30);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&msgsize,(long)iVar2 * 5);
    for (j._0_4_ = 0; iVar2 = mxx::comm::size((comm *)local_30), (int)j < iVar2;
        j._0_4_ = (int)j + 1) {
      for (result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage = (pointer)0x0;
          result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage < (pointer)0x5;
          result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               (pointer)((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 1)) {
        iVar2 = (int)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&msgsize,
                            (long)(int)j * 5 +
                            (long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
        *pvVar4 = iVar2 * 2 + (int)j * 3;
      }
    }
  }
  this_00 = (allocator<int> *)((long)&gtest_ar.message_.ptr_ + 7);
  std::allocator<int>::allocator(this_00);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&j_1,5,this_00);
  std::allocator<int>::~allocator((allocator<int> *)((long)&gtest_ar.message_.ptr_ + 7));
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&msgsize,0);
  out = std::vector<int,_std::allocator<int>_>::front((vector<int,_std::allocator<int>_> *)&j_1);
  mxx::scatter<int>(pvVar4,5,out,0,(comm *)local_30);
  for (gtest_ar.message_.ptr_._0_4_ = 0; (int)gtest_ar.message_.ptr_ < 5;
      gtest_ar.message_.ptr_._0_4_ = (int)gtest_ar.message_.ptr_ + 1) {
    iVar2 = (int)gtest_ar.message_.ptr_ * 2;
    iVar3 = mxx::comm::rank((comm *)local_30);
    local_a4 = iVar2 + iVar3 * 3;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&j_1,(long)(int)gtest_ar.message_.ptr_)
    ;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_a0,"2*j+3*c.rank()","result[j]",&local_a4,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
    if (!bVar1) {
      testing::Message::Message(&local_b0);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                 ,0x76,message);
      testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      testing::Message::~Message(&local_b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
    if (!bVar1) break;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&j_1);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&msgsize);
  mxx::comm::~comm((comm *)local_30);
  return;
}

Assistant:

TEST(MxxColl, ScatterGeneral) {
    mxx::comm c = MPI_COMM_WORLD;

    std::vector<int> vec;
    size_t msgsize = 5;

    // scatter from 0
    if (c.rank() == 0) {
        vec.resize(c.size()*msgsize);
        for (int i = 0; i < c.size(); ++i) {
            for (size_t j = 0; j < msgsize; ++j)
            {
                vec[i*msgsize + j] = 2*j + 3*i;
            }
        }
    }
    std::vector<int> result(msgsize);
    mxx::scatter(&vec[0], msgsize, &result.front(), 0, c);
    for (int j = 0; j < (int)msgsize; ++j) {
        ASSERT_EQ(2*j+3*c.rank(), result[j]);
    }
}